

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O2

double matd_plu_det(matd_plu_t *mlu)

{
  uint uVar1;
  matd_t *pmVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  double dVar6;
  
  dVar6 = (double)mlu->pivsign;
  pmVar2 = mlu->lu;
  uVar1 = pmVar2->nrows;
  uVar3 = (ulong)uVar1;
  if (uVar1 == pmVar2->ncols) {
    uVar4 = 0;
    while (bVar5 = uVar3 != 0, uVar3 = uVar3 - 1, bVar5) {
      dVar6 = dVar6 * (double)pmVar2[(ulong)uVar4 + 1];
      uVar4 = uVar4 + uVar1 + 1;
    }
  }
  return dVar6;
}

Assistant:

double matd_plu_det(const matd_plu_t *mlu)
{
    matd_t *lu = mlu->lu;
    double det = mlu->pivsign;

    if (lu->nrows == lu->ncols) {
        for (int i = 0; i < lu->ncols; i++)
            det *= MATD_EL(lu, i, i);
    }

    return det;
}